

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-a64.c
# Opt level: O1

void handle_simd_3same_pair
               (DisasContext_conflict1 *s,int is_q,int u,int opcode,int size,int rn,int rm,int rd)

{
  TCGContext_conflict1 *s_00;
  TCGContext_conflict1 *pTVar1;
  DisasContext_conflict1 *pDVar2;
  int iVar3;
  TCGTemp *pTVar4;
  TCGTemp *pTVar5;
  NeonGenTwoOpFn **ppNVar6;
  NeonGenTwoOpFn *pNVar7;
  ulong uVar8;
  uintptr_t o_1;
  long lVar9;
  uint uVar10;
  code *pcVar11;
  uintptr_t o_25;
  TCGv_i64 ret;
  uintptr_t o_22;
  long lVar12;
  uintptr_t o_19;
  TCGv_i32 pTVar13;
  TCGArg a3;
  uintptr_t o;
  long lVar14;
  uintptr_t o_21;
  TCGv_i32 tcg_res_1 [4];
  TCGTemp *local_c8;
  TCGv_i32 local_c0;
  TCGv_i64 local_b8;
  TCGTemp *local_a8;
  TCGv_i64 local_a0;
  int local_98;
  int local_94;
  int local_90;
  int local_8c;
  TCGTemp *local_88;
  long local_80;
  TCGv_i64 local_78;
  TCGTemp *local_68;
  DisasContext_conflict1 *local_60;
  TCGv_i64 local_58;
  NeonGenTwoOpFn **local_50;
  NeonGenTwoOpFn **local_48;
  ulong local_40;
  ulong local_38;
  
  local_98 = rd;
  local_94 = rm;
  s_00 = s->uc->tcg_ctx;
  local_90 = opcode;
  local_8c = rn;
  if (opcode < 0x58) {
    ret = (TCGv_i64)0x0;
  }
  else {
    pTVar4 = tcg_temp_new_internal_aarch64(s_00,TCG_TYPE_I64,false);
    ret = (TCGv_i64)((long)pTVar4 - (long)s_00);
    tcg_gen_addi_i64_aarch64(s_00,ret,(TCGv_i64)s_00->cpu_env,0x2ec8);
  }
  if (s->fp_access_checked == true) {
    __assert_fail("!s->fp_access_checked",
                  "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/translate-a64.c"
                  ,0x487,"_Bool fp_access_check(DisasContext *)");
  }
  s->fp_access_checked = true;
  if (s->fp_excp_el != 0) {
    gen_exception_insn(s,s->pc_curr,1,0x1fe0000a,s->fp_excp_el);
    return;
  }
  local_60 = s;
  local_58 = ret;
  if (size == 3) {
    lVar12 = 0;
    do {
      local_68 = tcg_temp_new_internal_aarch64(s_00,TCG_TYPE_I64,false);
      lVar14 = (long)local_68 - (long)s_00;
      local_a8 = tcg_temp_new_internal_aarch64(s_00,TCG_TYPE_I64,false);
      lVar9 = (long)local_a8 - (long)s_00;
      iVar3 = local_94;
      if (lVar12 == 0) {
        iVar3 = local_8c;
      }
      pTVar1 = s->uc->tcg_ctx;
      tcg_gen_op3_aarch64(pTVar1,INDEX_op_ld_i64,(long)pTVar1 + lVar14,
                          (TCGArg)(pTVar1->cpu_env + (long)pTVar1),(long)(iVar3 * 0x100 + 0xc10));
      pTVar1 = s->uc->tcg_ctx;
      tcg_gen_op3_aarch64(pTVar1,INDEX_op_ld_i64,(long)pTVar1 + lVar9,
                          (TCGArg)(pTVar1->cpu_env + (long)pTVar1),(long)(iVar3 * 0x100 + 0xc18));
      pTVar4 = tcg_temp_new_internal_aarch64(s_00,TCG_TYPE_I64,false);
      (&local_c8)[lVar12] = (TCGTemp *)((long)pTVar4 - (long)s_00);
      if (local_90 < 0x5e) {
        if (local_90 != 0x17) {
          if (local_90 == 0x58) {
            pcVar11 = helper_vfp_maxnumd_aarch64;
          }
          else {
            if (local_90 != 0x5a) {
LAB_006b42b4:
              iVar3 = 0x2bfd;
LAB_006b42ce:
              g_assertion_message_expr
                        ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/translate-a64.c"
                         ,iVar3,(char *)0x0);
            }
            pcVar11 = helper_vfp_addd_aarch64;
          }
          goto LAB_006b3e2c;
        }
        tcg_gen_op3_aarch64(s_00,INDEX_op_add_i64,(TCGArg)pTVar4,(TCGArg)local_68,(TCGArg)local_a8);
      }
      else {
        if (local_90 == 0x5e) {
          pcVar11 = helper_vfp_maxd_aarch64;
        }
        else if (local_90 == 0x78) {
          pcVar11 = helper_vfp_minnumd_aarch64;
        }
        else {
          if (local_90 != 0x7e) goto LAB_006b42b4;
          pcVar11 = helper_vfp_mind_aarch64;
        }
LAB_006b3e2c:
        local_80 = (long)s_00 + lVar9;
        local_88 = (TCGTemp *)((long)s_00 + lVar14);
        local_78 = ret + (long)&s_00->pool_cur;
        tcg_gen_callN_aarch64
                  (s_00,pcVar11,
                   (TCGTemp *)
                   ((long)&s_00->pool_cur +
                   (long)&((TCGTemp *)((long)pTVar4 - (long)s_00))->field_0x0),3,&local_88);
      }
      tcg_temp_free_internal_aarch64(s_00,(TCGTemp *)(lVar14 + (long)s_00));
      tcg_temp_free_internal_aarch64(s_00,(TCGTemp *)(lVar9 + (long)s_00));
      pDVar2 = local_60;
      lVar12 = lVar12 + 1;
    } while (lVar12 == 1);
    iVar3 = local_98 * 0x100;
    lVar12 = 0;
    do {
      lVar9 = *(long *)((long)&local_c8 + lVar12);
      pTVar1 = pDVar2->uc->tcg_ctx;
      tcg_gen_op3_aarch64(pTVar1,INDEX_op_st_i64,(long)&pTVar1->pool_cur + lVar9,
                          (TCGArg)(pTVar1->cpu_env + (long)pTVar1),(iVar3 + 0xc10) + lVar12);
      tcg_temp_free_internal_aarch64(s_00,(TCGTemp *)((long)&s_00->pool_cur + lVar9));
      lVar12 = lVar12 + 8;
    } while (lVar12 == 8);
  }
  else {
    uVar10 = (uint)(is_q != 0) * 2 + 2;
    local_68 = (TCGTemp *)(ulong)uVar10;
    local_38 = (ulong)(uVar10 >> 1);
    local_a0 = ret + (long)&s_00->pool_cur;
    local_40 = (ulong)(uint)size;
    local_48 = handle_simd_3same_pair::fns_2[local_40] + (uint)u;
    local_50 = handle_simd_3same_pair::fns_1[local_40] + (uint)u;
    uVar8 = 0;
    do {
      pTVar4 = tcg_temp_new_internal_aarch64(s_00,TCG_TYPE_I32,false);
      pTVar5 = tcg_temp_new_internal_aarch64(s_00,TCG_TYPE_I32,false);
      pDVar2 = local_60;
      pTVar13 = (TCGv_i32)((long)pTVar5 - (long)s_00);
      iVar3 = local_94;
      if (uVar8 < local_38) {
        iVar3 = local_8c;
      }
      uVar10 = (uint)((byte)uVar8 & is_q != 0);
      pTVar1 = local_60->uc->tcg_ctx;
      local_a8 = (TCGTemp *)((long)pTVar4 - (long)s_00);
      tcg_gen_op3_aarch64(pTVar1,INDEX_op_ld_i32,(long)pTVar1 + ((long)pTVar4 - (long)s_00),
                          (TCGArg)(pTVar1->cpu_env + (long)pTVar1),
                          (long)(int)(iVar3 * 0x100 + 0xc10 + uVar10 * 8));
      pTVar1 = pDVar2->uc->tcg_ctx;
      tcg_gen_op3_aarch64(pTVar1,INDEX_op_ld_i32,(TCGArg)((long)pTVar1 + (long)pTVar13),
                          (TCGArg)(pTVar1->cpu_env + (long)pTVar1),
                          (long)(int)(iVar3 * 0x100 + 0xc14 + uVar10 * 8));
      pTVar5 = tcg_temp_new_internal_aarch64(s_00,TCG_TYPE_I32,false);
      pTVar4 = local_a8;
      pTVar5 = (TCGTemp *)((long)pTVar5 - (long)s_00);
      (&local_88)[uVar8] = pTVar5;
      if (local_90 < 0x5a) {
        if (local_90 < 0x17) {
          ppNVar6 = local_50;
          if ((local_90 != 0x14) && (ppNVar6 = local_48, local_90 != 0x15)) {
LAB_006b42c2:
            iVar3 = 0x2c47;
            goto LAB_006b42ce;
          }
          pNVar7 = *ppNVar6;
        }
        else {
          if (local_90 != 0x17) {
            if (local_90 == 0x58) {
              pcVar11 = helper_vfp_maxnums_aarch64;
              goto LAB_006b4199;
            }
            goto LAB_006b42c2;
          }
          pNVar7 = handle_simd_3same_pair::fns[local_40];
        }
      }
      else {
        if (local_90 < 0x78) {
          if (local_90 == 0x5a) {
            pcVar11 = helper_vfp_adds_aarch64;
          }
          else {
            if (local_90 != 0x5e) goto LAB_006b42c2;
            pcVar11 = helper_vfp_maxs_aarch64;
          }
        }
        else if (local_90 == 0x78) {
          pcVar11 = helper_vfp_minnums_aarch64;
        }
        else {
          if (local_90 != 0x7e) goto LAB_006b42c2;
          pcVar11 = helper_vfp_mins_aarch64;
        }
LAB_006b4199:
        local_c0 = (TCGv_i32)((long)s_00 + (long)pTVar13);
        local_c8 = (TCGTemp *)(&local_a8->field_0x0 + (long)&s_00->pool_cur);
        local_b8 = local_a0;
        tcg_gen_callN_aarch64(s_00,pcVar11,(TCGTemp *)((long)s_00 + (long)pTVar5),3,&local_c8);
        pNVar7 = (NeonGenTwoOpFn *)0x0;
      }
      if (pNVar7 != (NeonGenTwoOpFn *)0x0) {
        (*pNVar7)(s_00,(TCGv_i32)pTVar5,(TCGv_i32)pTVar4,pTVar13);
      }
      tcg_temp_free_internal_aarch64
                (s_00,(TCGTemp *)((long)&s_00->pool_cur + (long)&pTVar4->field_0x0));
      tcg_temp_free_internal_aarch64(s_00,(TCGTemp *)(pTVar13 + (long)s_00));
      pDVar2 = local_60;
      iVar3 = local_98;
      uVar8 = uVar8 + 1;
    } while (local_68 != (TCGTemp *)uVar8);
    a3 = (TCGArg)(local_98 * 0x100 + 0xc10);
    lVar12 = 0;
    do {
      pTVar4 = (&local_88)[lVar12];
      pTVar1 = pDVar2->uc->tcg_ctx;
      tcg_gen_op3_aarch64(pTVar1,INDEX_op_st_i32,(long)&pTVar1->pool_cur + (long)pTVar4,
                          (TCGArg)(pTVar1->cpu_env + (long)pTVar1),a3);
      tcg_temp_free_internal_aarch64(s_00,(TCGTemp *)((long)&s_00->pool_cur + (long)pTVar4));
      lVar12 = lVar12 + 1;
      a3 = a3 + 4;
    } while (local_68 != (TCGTemp *)lVar12);
    clear_vec_high(pDVar2,is_q != 0,iVar3);
  }
  if (local_58 != (TCGv_i64)0x0) {
    tcg_temp_free_internal_aarch64(s_00,(TCGTemp *)(local_58 + (long)s_00));
  }
  return;
}

Assistant:

static void handle_simd_3same_pair(DisasContext *s, int is_q, int u, int opcode,
                                   int size, int rn, int rm, int rd)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv_ptr fpst;
    int pass;

    /* Floating point operations need fpst */
    if (opcode >= 0x58) {
        fpst = get_fpstatus_ptr(tcg_ctx, false);
    } else {
        fpst = NULL;
    }

    if (!fp_access_check(s)) {
        return;
    }

    /* These operations work on the concatenated rm:rn, with each pair of
     * adjacent elements being operated on to produce an element in the result.
     */
    if (size == 3) {
        TCGv_i64 tcg_res[2];

        for (pass = 0; pass < 2; pass++) {
            TCGv_i64 tcg_op1 = tcg_temp_new_i64(tcg_ctx);
            TCGv_i64 tcg_op2 = tcg_temp_new_i64(tcg_ctx);
            int passreg = (pass == 0) ? rn : rm;

            read_vec_element(s, tcg_op1, passreg, 0, MO_64);
            read_vec_element(s, tcg_op2, passreg, 1, MO_64);
            tcg_res[pass] = tcg_temp_new_i64(tcg_ctx);

            switch (opcode) {
            case 0x17: /* ADDP */
                tcg_gen_add_i64(tcg_ctx, tcg_res[pass], tcg_op1, tcg_op2);
                break;
            case 0x58: /* FMAXNMP */
                gen_helper_vfp_maxnumd(tcg_ctx, tcg_res[pass], tcg_op1, tcg_op2, fpst);
                break;
            case 0x5a: /* FADDP */
                gen_helper_vfp_addd(tcg_ctx, tcg_res[pass], tcg_op1, tcg_op2, fpst);
                break;
            case 0x5e: /* FMAXP */
                gen_helper_vfp_maxd(tcg_ctx, tcg_res[pass], tcg_op1, tcg_op2, fpst);
                break;
            case 0x78: /* FMINNMP */
                gen_helper_vfp_minnumd(tcg_ctx, tcg_res[pass], tcg_op1, tcg_op2, fpst);
                break;
            case 0x7e: /* FMINP */
                gen_helper_vfp_mind(tcg_ctx, tcg_res[pass], tcg_op1, tcg_op2, fpst);
                break;
            default:
                g_assert_not_reached();
            }

            tcg_temp_free_i64(tcg_ctx, tcg_op1);
            tcg_temp_free_i64(tcg_ctx, tcg_op2);
        }

        for (pass = 0; pass < 2; pass++) {
            write_vec_element(s, tcg_res[pass], rd, pass, MO_64);
            tcg_temp_free_i64(tcg_ctx, tcg_res[pass]);
        }
    } else {
        int maxpass = is_q ? 4 : 2;
        TCGv_i32 tcg_res[4];

        for (pass = 0; pass < maxpass; pass++) {
            TCGv_i32 tcg_op1 = tcg_temp_new_i32(tcg_ctx);
            TCGv_i32 tcg_op2 = tcg_temp_new_i32(tcg_ctx);
            NeonGenTwoOpFn *genfn = NULL;
            int passreg = pass < (maxpass / 2) ? rn : rm;
            int passelt = (is_q && (pass & 1)) ? 2 : 0;

            read_vec_element_i32(s, tcg_op1, passreg, passelt, MO_32);
            read_vec_element_i32(s, tcg_op2, passreg, passelt + 1, MO_32);
            tcg_res[pass] = tcg_temp_new_i32(tcg_ctx);

            switch (opcode) {
            case 0x17: /* ADDP */
            {
                static NeonGenTwoOpFn * const fns[3] = {
                    gen_helper_neon_padd_u8,
                    gen_helper_neon_padd_u16,
                    tcg_gen_add_i32,
                };
                genfn = fns[size];
                break;
            }
            case 0x14: /* SMAXP, UMAXP */
            {
                static NeonGenTwoOpFn * const fns[3][2] = {
                    { gen_helper_neon_pmax_s8, gen_helper_neon_pmax_u8 },
                    { gen_helper_neon_pmax_s16, gen_helper_neon_pmax_u16 },
                    { tcg_gen_smax_i32, tcg_gen_umax_i32 },
                };
                genfn = fns[size][u];
                break;
            }
            case 0x15: /* SMINP, UMINP */
            {
                static NeonGenTwoOpFn * const fns[3][2] = {
                    { gen_helper_neon_pmin_s8, gen_helper_neon_pmin_u8 },
                    { gen_helper_neon_pmin_s16, gen_helper_neon_pmin_u16 },
                    { tcg_gen_smin_i32, tcg_gen_umin_i32 },
                };
                genfn = fns[size][u];
                break;
            }
            /* The FP operations are all on single floats (32 bit) */
            case 0x58: /* FMAXNMP */
                gen_helper_vfp_maxnums(tcg_ctx, tcg_res[pass], tcg_op1, tcg_op2, fpst);
                break;
            case 0x5a: /* FADDP */
                gen_helper_vfp_adds(tcg_ctx, tcg_res[pass], tcg_op1, tcg_op2, fpst);
                break;
            case 0x5e: /* FMAXP */
                gen_helper_vfp_maxs(tcg_ctx, tcg_res[pass], tcg_op1, tcg_op2, fpst);
                break;
            case 0x78: /* FMINNMP */
                gen_helper_vfp_minnums(tcg_ctx, tcg_res[pass], tcg_op1, tcg_op2, fpst);
                break;
            case 0x7e: /* FMINP */
                gen_helper_vfp_mins(tcg_ctx, tcg_res[pass], tcg_op1, tcg_op2, fpst);
                break;
            default:
                g_assert_not_reached();
            }

            /* FP ops called directly, otherwise call now */
            if (genfn) {
                genfn(tcg_ctx, tcg_res[pass], tcg_op1, tcg_op2);
            }

            tcg_temp_free_i32(tcg_ctx, tcg_op1);
            tcg_temp_free_i32(tcg_ctx, tcg_op2);
        }

        for (pass = 0; pass < maxpass; pass++) {
            write_vec_element_i32(s, tcg_res[pass], rd, pass, MO_32);
            tcg_temp_free_i32(tcg_ctx, tcg_res[pass]);
        }
        clear_vec_high(s, is_q, rd);
    }

    if (fpst) {
        tcg_temp_free_ptr(tcg_ctx, fpst);
    }
}